

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void UnRegisterModule(nodecontext *p,nodemodule *Module,bool_t IncludingModule)

{
  thisnode p_00;
  node *Node;
  node **j;
  nodeclass **i;
  bool_t IncludingModule_local;
  nodemodule *Module_local;
  nodecontext *p_local;
  
  if (p == (nodecontext *)0xffffffffffffffa0) {
    __assert_fail("&(p->NodeSingleton)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x17c,"void UnRegisterModule(nodecontext *, nodemodule *, bool_t)");
  }
  Node = (node *)(p->NodeSingleton)._Begin;
  do {
    if (p == (nodecontext *)0xffffffffffffffa0) {
      __assert_fail("&(p->NodeSingleton)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x17c,"void UnRegisterModule(nodecontext *, nodemodule *, bool_t)");
    }
    if (Node == (node *)((p->NodeSingleton)._Begin + ((p->NodeSingleton)._Used & 0xfffffffffffffff8)
                        )) {
      if (((nodecontext *)Module != p) && ((Module->Base).RefCount != 1)) {
        __assert_fail("Module==&p->Base || Module->Base.RefCount==1",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x188,"void UnRegisterModule(nodecontext *, nodemodule *, bool_t)");
      }
      if (p == (nodecontext *)0xffffffffffffff90) {
        __assert_fail("&(p->NodeClass)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x18a,"void UnRegisterModule(nodecontext *, nodemodule *, bool_t)");
      }
      j = (node **)(p->NodeClass)._Begin;
      while( true ) {
        if (p == (nodecontext *)0xffffffffffffff90) {
          __assert_fail("&(p->NodeClass)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                        ,0x18a,"void UnRegisterModule(nodecontext *, nodemodule *, bool_t)");
        }
        if (j == (node **)((p->NodeClass)._Begin + ((p->NodeClass)._Used & 0xfffffffffffffff8)))
        break;
        if (((*j)->VMT != (void *)0x0) && ((nodemodule *)(*j)->Data == Module)) {
          if ('\0' < *(char *)((long)&(*j)[1].RefCount + 5)) {
            UnInitClass(p,(nodeclass *)*j,IncludingModule);
          }
          (*j)->VMT = (void *)0x0;
        }
        j = j + 1;
      }
      return;
    }
    if (*(nodemodule **)(*(long *)(*(long *)Node + 8) + -0x38) == Module) {
      p_00 = *(thisnode *)Node;
      if (p == (nodecontext *)0xffffffffffffffa0) {
        __assert_fail("&(p->NodeSingleton)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x181,"void UnRegisterModule(nodecontext *, nodemodule *, bool_t)");
      }
      ArrayDelete(&p->NodeSingleton,(long)Node - (long)(p->NodeSingleton)._Begin,8);
      Node_Release(p_00);
      if (p == (nodecontext *)0xffffffffffffffa0) {
        __assert_fail("&(p->NodeSingleton)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x183,"void UnRegisterModule(nodecontext *, nodemodule *, bool_t)");
      }
      Node = (node *)((p->NodeSingleton)._Begin + -8);
    }
    Node = (node *)&Node->VMT;
  } while( true );
}

Assistant:

static void UnRegisterModule(nodecontext* p, nodemodule* Module, bool_t IncludingModule)
{
    nodeclass** i;
    node** j;

    // release singleton objects
    for (j=ARRAYBEGIN(p->NodeSingleton,node*);j!=ARRAYEND(p->NodeSingleton,node*);++j)
    {
        if (NodeGetClass(*j)->Module == Module)
        {
            node* Node = *j;
            ArrayDelete(&p->NodeSingleton,(uint8_t*)j-ARRAYBEGIN(p->NodeSingleton,uint8_t),sizeof(node*));
            Node_Release(Node);
            j = ARRAYBEGIN(p->NodeSingleton,node*)-1;
        }
    }

    // node memory leak in this module? (root module checked in NodeContext_Done)
    assert(Module==&p->Base || Module->Base.RefCount==1);

    for (i=ARRAYBEGIN(p->NodeClass,nodeclass*);i!=ARRAYEND(p->NodeClass,nodeclass*);++i)
        if ((*i)->Meta && (*i)->Module == Module)
        {
            if ((*i)->State>=CLASS_INITED)
                UnInitClass(p,(*i),IncludingModule);
            (*i)->Meta = NULL;
        }
}